

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O3

void test_qclab_qgates_SWAP<std::complex<double>>(void)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  allocator_type aVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  pointer piVar12;
  pointer *__ptr;
  undefined8 *puVar13;
  _Type aiVar14;
  AssertHelperData *pAVar15;
  __uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
  _Var16;
  iterator pcVar17;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var18;
  long lVar19;
  char *pcVar20;
  char *in_R9;
  undefined1 auVar21 [8];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var22;
  undefined1 uVar23;
  undefined1 uVar24;
  pointer *__ptr_12;
  pointer *__ptr_2;
  byte bVar25;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::complex<double>_> __l_09;
  initializer_list<std::complex<double>_> __l_10;
  initializer_list<std::complex<double>_> __l_11;
  initializer_list<std::complex<double>_> __l_12;
  SWAP<std::complex<double>_> swap_1;
  V vec4;
  int qubits_1 [2];
  vector<int,_std::allocator<int>_> qubits;
  SWAP<std::complex<double>_> swap;
  V check4;
  stringstream qasm;
  V v4;
  V v3;
  V v2;
  undefined1 local_330 [8];
  array<int,_2UL> local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_308;
  pointer local_300;
  undefined1 local_2f8 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_2f0;
  pointer local_2e8;
  undefined1 local_2e0 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_2d8;
  pointer local_2d0;
  undefined1 local_2c8 [8];
  array<int,_2UL> local_2c0;
  pointer local_2b8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_2b0;
  SWAP<std::complex<double>_> local_298;
  AssertHelper local_288;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_280;
  AssertHelper local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  undefined1 local_268 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> _Stack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 *local_248;
  undefined8 uStack_240;
  undefined1 *local_238;
  undefined8 uStack_230;
  ios_base local_1e8 [128];
  undefined1 local_168 [144];
  SquareMatrix<std::complex<double>_> local_d8;
  SquareMatrix<std::complex<double>_> local_c8;
  SquareMatrix<std::complex<double>_> local_b8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_a8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_90;
  SquareMatrix<std::complex<double>_> local_78;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_68;
  SquareMatrix<std::complex<double>_> local_50;
  undefined1 local_40 [8];
  void *local_38;
  
  bVar25 = 0;
  qclab::dense::eye<std::complex<double>>((int64_t)&local_78);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_50);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_b8);
  qclab::dense::eye<std::complex<double>>((int64_t)local_40);
  local_238 = &DAT_401c000000000000;
  uStack_230 = 0;
  local_248 = (undefined1 *)0x4000000000000000;
  uStack_240 = 0;
  local_258._M_allocated_capacity = (size_type)&DAT_4014000000000000;
  local_258._8_8_ = 0;
  local_268 = (undefined1  [8])&DAT_4008000000000000;
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  __l._M_len = 4;
  __l._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_68,__l,(allocator_type *)local_330);
  puVar7 = &DAT_0045ecd0;
  pcVar17 = (iterator)local_268;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined8 *)pcVar17->_M_value = *puVar7;
    puVar7 = puVar7 + (ulong)bVar25 * -2 + 1;
    pcVar17 = (iterator)(pcVar17[-(ulong)bVar25]._M_value + 8);
  }
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_90,__l_00,(allocator_type *)local_330);
  memcpy((iterator)local_268,&DAT_0045ed50,0x100);
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_a8,__l_01,(allocator_type *)local_330);
  local_2c8 = (undefined1  [8])&PTR_nbQubits_004ee530;
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 1;
  local_330._0_4_ = 2;
  local_2e0._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"swap.nbQubits()","2",(int *)local_330,(int *)local_2e0);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
        _Stack_260._M_head_impl ==
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)_Stack_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x15,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if (_Stack_260._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_330._0_4_ = local_2c0._M_elems[0];
  local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"swap.qubit()","0",(int *)local_330,(int *)local_2e0);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
        _Stack_260._M_head_impl ==
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)_Stack_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1a,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if (_Stack_260._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_268._0_4_ = local_2c0._M_elems[0];
  local_268._4_4_ = local_2c0._M_elems[1];
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_268;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_2e0,__l_02,(allocator_type *)local_330);
  local_330 = (undefined1  [8])((long)local_2d8._M_head_impl - (long)local_2e0 >> 2);
  local_2f8._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_268,"qubits.size()","2",(unsigned_long *)local_330,(int *)local_2f8);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if (_Stack_260._M_head_impl == (complex<double> *)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)_Stack_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1e,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      _Stack_260._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"qubits[0]","0",(int *)local_2e0,(int *)local_330);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((_Alloc_hider *)(_Stack_260._M_head_impl)->_M_value)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1f,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_330._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"qubits[1]","1",(int *)((long)local_2e0 + 4),(int *)local_330);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((_Alloc_hider *)(_Stack_260._M_head_impl)->_M_value)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x20,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_2c0._M_elems = (_Type)&DAT_500000003;
  local_2f8 = (undefined1  [8])&DAT_500000003;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_2f8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_03,(allocator_type *)local_310);
  local_2f8._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.qubits()[0]","3",(int *)local_268,(int *)local_2f8);
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x23,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  local_2f8._0_4_ = local_2c0._M_elems[0];
  local_2f8._4_4_ = local_2c0._M_elems[1];
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_2f8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_04,(allocator_type *)local_310);
  local_2f8._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.qubits()[1]","5",(int *)((long)local_268 + 4),
             (int *)local_2f8);
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x24,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_268 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 1;
  puVar7 = (undefined8 *)operator_new__(0x100);
  *puVar7 = 0x3ff0000000000000;
  puVar7[1] = 0;
  puVar7[2] = 0;
  puVar7[3] = 0;
  puVar7[4] = 0;
  puVar7[5] = 0;
  puVar7[6] = 0;
  puVar7[7] = 0;
  puVar7[8] = 0;
  puVar7[9] = 0;
  puVar7[10] = 0;
  puVar7[0xb] = 0;
  puVar7[0xc] = 0x3ff0000000000000;
  puVar7[0xd] = 0;
  puVar7[0xe] = 0;
  puVar7[0xf] = 0;
  puVar7[0x10] = 0;
  puVar7[0x11] = 0;
  puVar7[0x12] = 0x3ff0000000000000;
  puVar7[0x13] = 0;
  puVar7[0x14] = 0;
  puVar7[0x15] = 0;
  puVar7[0x16] = 0;
  puVar7[0x17] = 0;
  puVar7[0x18] = 0;
  puVar7[0x19] = 0;
  puVar7[0x1a] = 0;
  puVar7[0x1b] = 0;
  puVar7[0x1c] = 0;
  puVar7[0x1d] = 0;
  puVar7[0x1e] = 0x3ff0000000000000;
  puVar7[0x1f] = 0;
  puVar8 = (undefined8 *)operator_new__(0x100);
  *puVar8 = 0x3ff0000000000000;
  puVar10 = puVar8 + 1;
  puVar8[1] = 0;
  puVar8[2] = 0;
  puVar8[3] = 0;
  puVar8[4] = 0;
  puVar8[5] = 0;
  puVar8[6] = 0;
  puVar8[7] = 0;
  puVar8[8] = 0;
  puVar8[9] = 0;
  puVar8[10] = 0;
  lVar9 = 0;
  puVar8[0xb] = 0;
  puVar8[0xc] = 0x3ff0000000000000;
  puVar8[0xd] = 0;
  puVar8[0xe] = 0;
  puVar8[0xf] = 0;
  puVar8[0x10] = 0;
  puVar8[0x11] = 0;
  puVar8[0x12] = 0x3ff0000000000000;
  puVar8[0x13] = 0;
  puVar8[0x14] = 0;
  puVar8[0x15] = 0;
  puVar8[0x16] = 0;
  puVar8[0x17] = 0;
  puVar8[0x18] = 0;
  puVar8[0x19] = 0;
  puVar8[0x1a] = 0;
  puVar8[0x1b] = 0;
  puVar8[0x1c] = 0;
  puVar8[0x1d] = 0;
  puVar8[0x1e] = 0x3ff0000000000000;
  puVar8[0x1f] = 0;
  puVar13 = puVar7 + 1;
  do {
    lVar19 = 0;
    do {
      bVar3 = *(double *)((long)puVar13 + lVar19 + -8) == *(double *)((long)puVar10 + lVar19 + -8);
      bVar4 = *(double *)((long)puVar10 + lVar19) == *(double *)((long)puVar13 + lVar19);
      if (!bVar4 || !bVar3) goto LAB_00346454;
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x40);
    lVar9 = lVar9 + 1;
    puVar10 = puVar10 + 8;
    puVar13 = puVar13 + 8;
  } while (lVar9 != 4);
LAB_00346454:
  local_330[0] = (allocator_type)(bVar4 && bVar3);
  local_328._M_elems[0] = 0;
  local_328._M_elems[1] = 0;
  operator_delete__(puVar8);
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_330,
               (AssertionResult *)"swap.matrix() == SWAP_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x2e,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  qclab::qgates::QGate2<std::complex<double>_>::print((QGate2<std::complex<double>_> *)local_2c8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_268);
  iVar6 = qclab::qgates::SWAP<std::complex<double>_>::toQASM
                    ((SWAP<std::complex<double>_> *)local_2c8,(ostream *)local_258._M_local_buf,0);
  local_2f8._0_4_ = iVar6;
  local_310 = (undefined1  [8])((ulong)(uint)local_310._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.toQASM( qasm )","0",(int *)local_2f8,(int *)local_310);
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_2f8);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x35,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[18]>
            ((internal *)local_2f8,"qasm.str()","\"swap q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
             (char (*) [18])0x45f65e);
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
  }
  if (local_2f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
        local_2f0._M_head_impl ==
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_2f0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x36,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_330 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_330 + 8))();
    }
  }
  if (local_2f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._M_head_impl);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_330,(long)local_328._M_elems);
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
  }
  local_2f8 = (undefined1  [8])&PTR_nbQubits_004ee530;
  local_2f0._M_head_impl = (complex<double> *)0x400000002;
  iVar6 = (**(_func_int **)((long)local_2c8 + 0x70))();
  aVar5 = SUB41(iVar6,0);
  local_308._M_head_impl = (complex<double> *)0x0;
  local_310[0] = aVar5;
  if (aVar5 == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_330,(internal *)local_310,(AssertionResult *)"swap == swap2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3b,(char *)local_330);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if (local_330 != (undefined1  [8])&local_320) {
      operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
    if (local_308._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_308._M_head_impl);
    }
  }
  iVar6 = (**(_func_int **)((long)local_2c8 + 0x70))(local_2c8,local_2f8);
  local_310[0] = (allocator_type)(char)iVar6;
  local_308._M_head_impl = (complex<double> *)0x0;
  if ((char)iVar6 == '\0') {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_330,(internal *)local_310,(AssertionResult *)"swap != swap2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3c,(char *)local_330);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if (local_330 != (undefined1  [8])&local_320) {
      operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
    if (local_308._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_308._M_head_impl);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_268);
  std::ios_base::~ios_base(local_1e8);
  operator_delete__(puVar7);
  if (local_2e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2e0,(long)local_2d0 - (long)local_2e0);
  }
  local_330._0_4_ = 2;
  local_2e0._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"swap.nbQubits()","2",(int *)local_330,(int *)local_2e0);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_330);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((_Alloc_hider *)(_Stack_260._M_head_impl)->_M_value)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x42,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if (local_330 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_330 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_260._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_2e0 = (undefined1  [8])&DAT_500000003;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)local_2e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_05,(allocator_type *)local_2c8);
  local_2e0._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.qubits()[0]","3",(int *)local_268,(int *)local_2e0);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_268 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x45,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  local_2e0 = (undefined1  [8])&DAT_500000003;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_2e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_06,(allocator_type *)local_2c8);
  local_2e0._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_330,"swap.qubits()[1]","5",(int *)((long)local_268 + 4),
             (int *)local_2e0);
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_330[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_328._M_elems == (_Type)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_328._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x46,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2e0,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_268 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if (local_328._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_328._M_elems);
  }
  local_2f8 = (undefined1  [8])&DAT_500000003;
  qclab::qgates::SWAP<std::complex<double>_>::SWAP
            ((SWAP<std::complex<double>_> *)local_330,(int *)local_2f8);
  local_2e0._0_4_ = 2;
  local_2c8._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_268,"swap.nbQubits()","2",(int *)local_2e0,(int *)local_2c8);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2e0);
    if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
        _Stack_260._M_head_impl ==
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)_Stack_260._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4d,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c8,(Message *)local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c8);
    if (local_2e0 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_2e0 + 8))();
    }
  }
  if (_Stack_260._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_260._M_head_impl);
  }
  local_2c8._0_4_ = local_328._M_elems[0];
  local_2c8._4_4_ = local_328._M_elems[1];
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_2c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_07,(allocator_type *)local_310);
  local_2c8._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2e0,"swap.qubits()[0]","3",(int *)local_268,(int *)local_2c8);
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_268);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = ((_Alloc_hider *)(local_2d8._M_head_impl)->_M_value)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x50,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c8,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_268 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2d8._M_head_impl);
  }
  local_2c8._0_4_ = local_328._M_elems[0];
  local_2c8._4_4_ = local_328._M_elems[1];
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)local_2c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_268,__l_08,(allocator_type *)local_310);
  local_2c8._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2e0,"swap.qubits()[1]","5",(int *)((long)local_268 + 4),
             (int *)local_2c8);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_268 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_268,local_258._M_allocated_capacity - (long)local_268);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_2d8._M_head_impl == (complex<double> *)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_2d8._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x51,pcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c8,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c8);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_268 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_2d8._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2d8._M_head_impl);
  }
  local_298.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (QObject<std::complex<double>_>)&PTR_nbQubits_004ee530;
  local_298.qubits_._M_elems[0] = 0;
  local_298.qubits_._M_elems[1] = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_330,
             &local_68);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_298,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_330,0);
  local_238 = &DAT_401c000000000000;
  uStack_230 = 0;
  local_248 = &DAT_4014000000000000;
  uStack_240 = 0;
  local_258._M_allocated_capacity = (size_type)&DAT_4000000000000000;
  local_258._8_8_ = 0;
  local_268 = (undefined1  [8])&DAT_4008000000000000;
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  __l_09._M_len = 4;
  __l_09._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2e0,
             __l_09,(allocator_type *)local_2c8);
  if ((long)local_328._M_elems - (long)local_330 == (long)local_2d8._M_head_impl - (long)local_2e0)
  {
    if ((_Type)local_330 != local_328._M_elems) {
      lVar9 = 0;
      do {
        pdVar1 = (double *)
                 ((long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2e0 + lVar9);
        if ((((*(double *)((long)local_330 + lVar9) != *pdVar1) ||
             (NAN(*(double *)((long)local_330 + lVar9)) || NAN(*pdVar1))) ||
            (pdVar1 = (double *)((long)((long)local_2e0 + 8) + lVar9),
            *(double *)((long)local_330 + lVar9 + 8) != *pdVar1)) ||
           (NAN(*(double *)((long)local_330 + lVar9 + 8)) || NAN(*pdVar1))) goto LAB_00346f78;
        lVar19 = lVar9 + 0x10;
        lVar9 = lVar9 + 0x10;
      } while ((_Type)((long)local_330 + lVar19) != local_328._M_elems);
    }
  }
  else {
LAB_00346f78:
    local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffffffffff00);
    local_2c0._M_elems[0] = 0;
    local_2c0._M_elems[1] = 0;
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2c8,(AssertionResult *)"vec2 == check2","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x5b,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
    if (local_2c0._M_elems != (_Type)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2c0._M_elems);
    }
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2c8,
             &local_90);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_298,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2c8,0);
  puVar7 = &DAT_0045ee90;
  pcVar17 = (iterator)local_268;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined8 *)pcVar17->_M_value = *puVar7;
    puVar7 = puVar7 + (ulong)bVar25 * -2 + 1;
    pcVar17 = (iterator)(pcVar17[-(ulong)bVar25]._M_value + 8);
  }
  __l_10._M_len = 8;
  __l_10._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2f8,
             __l_10,(allocator_type *)local_310);
  if ((long)local_2c0._M_elems - (long)local_2c8 == (long)local_2f0._M_head_impl - (long)local_2f8)
  {
    if ((_Type)local_2c8 != local_2c0._M_elems) {
      lVar9 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)local_2c8)->_M_p + lVar9);
        pdVar1 = (double *)((long)(Type *)local_2f8 + lVar9);
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           ((dVar2 = *(double *)((long)((long)local_2c8 + 8) + lVar9),
            pdVar1 = (double *)((long)((long)local_2f8 + 8) + lVar9), dVar2 != *pdVar1 ||
            (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_003470f8;
        aiVar14 = (_Type)((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)local_2c8 + 0x10))->_M_local_buf + lVar9);
        lVar9 = lVar9 + 0x10;
      } while (aiVar14 != local_2c0._M_elems);
    }
  }
  else {
LAB_003470f8:
    local_310 = (undefined1  [8])((ulong)local_310 & 0xffffffffffffff00);
    local_308._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_310,(AssertionResult *)"vec3 == check3","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x67,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
    if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
        local_308._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_308._M_head_impl);
    }
  }
  local_298.qubits_._M_elems[0] = 1;
  local_298.qubits_._M_elems[1] = 2;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2c8,
             &local_90);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_298,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2c8,0);
  puVar7 = &DAT_0045ef10;
  puVar8 = (undefined8 *)local_268;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar25 * -2 + 1;
    puVar8 = puVar8 + (ulong)bVar25 * -2 + 1;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_2f8,
             local_268,local_1e8);
  if ((long)local_2c0._M_elems - (long)local_2c8 == (long)local_2f0._M_head_impl - (long)local_2f8)
  {
    if ((_Type)local_2c8 != local_2c0._M_elems) {
      lVar9 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)local_2c8)->_M_p + lVar9);
        pdVar1 = (double *)((long)(Type *)local_2f8 + lVar9);
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           ((dVar2 = *(double *)((long)((long)local_2c8 + 8) + lVar9),
            pdVar1 = (double *)((long)((long)local_2f8 + 8) + lVar9), dVar2 != *pdVar1 ||
            (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_0034729a;
        aiVar14 = (_Type)((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)local_2c8 + 0x10))->_M_local_buf + lVar9);
        lVar9 = lVar9 + 0x10;
      } while (aiVar14 != local_2c0._M_elems);
    }
  }
  else {
LAB_0034729a:
    local_310 = (undefined1  [8])((ulong)local_310 & 0xffffffffffffff00);
    local_308._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_310,(AssertionResult *)"vec3 == check3","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x74,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
    if (local_308._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_308._M_head_impl);
    }
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_310,
             &local_a8);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_298,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_310,0);
  memcpy((iterator)local_268,&DAT_0045ef90,0x100);
  __l_11._M_len = 0x10;
  __l_11._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_2b0,__l_11,(allocator_type *)&local_278);
  if ((long)local_308._M_head_impl - (long)local_310 ==
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    if (local_310 != (undefined1  [8])local_308._M_head_impl) {
      lVar9 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)local_310)->_M_p + lVar9);
        pdVar1 = (double *)
                 ((long)(local_2b0.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar9);
        if ((((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
            (dVar2 = *(double *)((long)((long)local_310 + 8) + lVar9),
            pdVar1 = (double *)
                     ((long)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar9 + 8),
            dVar2 != *pdVar1)) || (NAN(dVar2) || NAN(*pdVar1))) goto LAB_0034743a;
        pAVar15 = (AssertHelperData *)
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_310 + 0x10))->_M_local_buf + lVar9);
        lVar9 = lVar9 + 0x10;
      } while (pAVar15 != (AssertHelperData *)local_308._M_head_impl);
    }
  }
  else {
LAB_0034743a:
    local_278.data_._0_1_ = (allocator_type)0x0;
    local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)&local_278,(AssertionResult *)"vec4 == check4",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x80,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_280._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._M_head_impl + 8))();
    }
    if (local_270 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_270,local_270);
    }
  }
  local_298.qubits_._M_elems[0] = 0;
  local_298.qubits_._M_elems[1] = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_310,
             &local_a8);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_298,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_310,0);
  memcpy(local_268,&DAT_0045f090,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_2b0,
             local_268,local_168);
  if ((long)local_308._M_head_impl - (long)local_310 ==
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    if (local_310 != (undefined1  [8])local_308._M_head_impl) {
      lVar9 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)local_310)->_M_p + lVar9);
        pdVar1 = (double *)
                 ((long)(local_2b0.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar9);
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           ((dVar2 = *(double *)((long)((long)local_310 + 8) + lVar9),
            pdVar1 = (double *)
                     ((long)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar9 + 8),
            dVar2 != *pdVar1 || (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_003475f0;
        _Var16.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
             (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
             ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)local_310 + 0x10))->_M_local_buf + lVar9);
        lVar9 = lVar9 + 0x10;
      } while (_Var16.
               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
               local_308._M_head_impl);
    }
  }
  else {
LAB_003475f0:
    local_278.data_._0_1_ = (allocator_type)0x0;
    local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)&local_278,(AssertionResult *)"vec4 == check4",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x8e,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_280._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._M_head_impl + 8))();
    }
    if (local_270 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_270,local_270);
    }
  }
  local_298.qubits_._M_elems = (_Type)&DAT_300000002;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_310,
             &local_a8);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            (&local_298,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_310,0);
  memcpy(local_268,&DAT_0045f190,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_2b0,
             local_268,local_168);
  if ((long)local_308._M_head_impl - (long)local_310 ==
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)local_2b0.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
    if (local_310 != (undefined1  [8])local_308._M_head_impl) {
      lVar9 = 0;
      do {
        dVar2 = *(double *)((long)&((_Alloc_hider *)local_310)->_M_p + lVar9);
        pdVar1 = (double *)
                 ((long)(local_2b0.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar9);
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           ((dVar2 = *(double *)((long)((long)local_310 + 8) + lVar9),
            pdVar1 = (double *)
                     ((long)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar9 + 8),
            dVar2 != *pdVar1 || (NAN(dVar2) || NAN(*pdVar1))))) goto LAB_003477a6;
        pAVar15 = (AssertHelperData *)
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_310 + 0x10))->_M_local_buf + lVar9);
        lVar9 = lVar9 + 0x10;
      } while (pAVar15 != (AssertHelperData *)local_308._M_head_impl);
    }
  }
  else {
LAB_003477a6:
    local_278.data_._0_1_ = (allocator_type)0x0;
    local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)&local_278,(AssertionResult *)"vec4 == check4",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x9c,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_280._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._M_head_impl + 8))();
    }
    if (local_270 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_270,local_270);
    }
  }
  if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_310 != (undefined1  [8])0x0) {
    operator_delete((void *)local_310,(long)local_300 - (long)local_310);
  }
  if (local_2f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2f8,(long)local_2e8 - (long)local_2f8);
  }
  if (local_2c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2c8,(long)local_2b8 - (long)local_2c8);
  }
  if (local_2e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2e0,(long)local_2d0 - (long)local_2e0);
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_330 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_330,local_320._M_allocated_capacity - (long)local_330);
  }
  local_2c8 = (undefined1  [8])&PTR_nbQubits_004ee530;
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 2;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_330,
             &local_90);
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_2c8,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_330,0);
  puVar7 = &DAT_0045f290;
  pcVar17 = (iterator)local_268;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined8 *)pcVar17->_M_value = *puVar7;
    puVar7 = puVar7 + (ulong)bVar25 * -2 + 1;
    pcVar17 = (iterator)(pcVar17[-(ulong)bVar25]._M_value + 8);
  }
  __l_12._M_len = 8;
  __l_12._M_array = (iterator)local_268;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_2e0,
             __l_12,(allocator_type *)local_2f8);
  if ((long)local_328._M_elems - (long)local_330 == (long)local_2d8._M_head_impl - (long)local_2e0)
  {
    if ((_Type)local_330 != local_328._M_elems) {
      lVar9 = 0;
      do {
        pdVar1 = (double *)
                 ((long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2e0 + lVar9);
        if ((((*(double *)((long)local_330 + lVar9) != *pdVar1) ||
             (NAN(*(double *)((long)local_330 + lVar9)) || NAN(*pdVar1))) ||
            (pdVar1 = (double *)((long)((long)local_2e0 + 8) + lVar9),
            *(double *)((long)local_330 + lVar9 + 8) != *pdVar1)) ||
           (NAN(*(double *)((long)local_330 + lVar9 + 8)) || NAN(*pdVar1))) goto LAB_003479e5;
        lVar19 = lVar9 + 0x10;
        lVar9 = lVar9 + 0x10;
      } while ((_Type)((long)local_330 + lVar19) != local_328._M_elems);
    }
  }
  else {
LAB_003479e5:
    local_2f8 = (undefined1  [8])((ulong)local_2f8 & 0xffffffffffffff00);
    local_2f0._M_head_impl = (complex<double> *)0x0;
    testing::Message::Message((Message *)local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2f8,(AssertionResult *)"vec3 == check3","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xac,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_310 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_310 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2f0._M_head_impl);
    }
  }
  if (local_2e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2e0,(long)local_2d0 - (long)local_2e0);
  }
  if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )local_330 !=
      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    operator_delete((void *)local_330,local_320._M_allocated_capacity - (long)local_330);
  }
  local_330 = (undefined1  [8])&PTR_nbQubits_004ee530;
  local_328._M_elems[0] = 0;
  local_328._M_elems[1] = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_2e0,&local_50);
  pcVar20 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_2e0,0);
  puVar7 = (undefined8 *)operator_new__(0x100);
  *puVar7 = 0x3ff0000000000000;
  puVar7[1] = 0;
  puVar7[2] = 0;
  puVar7[3] = 0;
  puVar7[4] = 0;
  puVar7[5] = 0;
  puVar7[6] = 0;
  puVar7[7] = 0;
  puVar7[8] = 0;
  puVar7[9] = 0;
  puVar7[10] = 0;
  puVar7[0xb] = 0;
  puVar7[0xc] = 0x3ff0000000000000;
  puVar7[0xd] = 0;
  puVar7[0xe] = 0;
  puVar7[0xf] = 0;
  puVar7[0x10] = 0;
  puVar7[0x11] = 0;
  puVar7[0x12] = 0x3ff0000000000000;
  puVar7[0x13] = 0;
  puVar7[0x14] = 0;
  puVar7[0x15] = 0;
  puVar7[0x16] = 0;
  puVar7[0x17] = 0;
  puVar7[0x18] = 0;
  puVar7[0x19] = 0;
  puVar7[0x1a] = 0;
  puVar7[0x1b] = 0;
  puVar7[0x1c] = 0;
  puVar7[0x1d] = 0;
  puVar7[0x1e] = 0x3ff0000000000000;
  puVar7[0x1f] = 0;
  uVar24 = 0;
  if (local_2e0 == (undefined1  [8])&DAT_00000004) {
    psVar11 = (size_type *)((long)local_2d8._M_head_impl + 8);
    puVar8 = puVar7 + 1;
    lVar9 = 0;
    do {
      lVar19 = 0;
      do {
        dVar2 = *(double *)((long)puVar8 + lVar19 + -8);
        pdVar1 = (double *)((long)psVar11 + lVar19 + -8);
        uVar24 = 0;
        if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
           ((uVar24 = 0, *(double *)((long)puVar8 + lVar19) != *(double *)((long)psVar11 + lVar19)
            || (NAN(*(double *)((long)puVar8 + lVar19)) || NAN(*(double *)((long)psVar11 + lVar19)))
            ))) goto LAB_00347c0a;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x40);
      lVar9 = lVar9 + 1;
      psVar11 = psVar11 + 8;
      puVar8 = puVar8 + 8;
      uVar24 = 1;
    } while (lVar9 != 4);
  }
LAB_00347c0a:
  local_2c8[0] = (allocator_type)uVar24;
  local_2c0._M_elems[0] = 0;
  local_2c0._M_elems[1] = 0;
  operator_delete__(puVar7);
  if (local_2c8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2c8,(AssertionResult *)"mat2 == swap.matrix()",
               "false","true",pcVar20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xbb,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
  }
  if (local_2c0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2c0._M_elems);
  }
  local_2c8 = (undefined1  [8])&DAT_00000004;
  local_2c0._M_elems = (_Type)operator_new__(0x100);
  *(undefined8 *)local_2c0._M_elems = 0x3ff0000000000000;
  *(size_type *)((long)local_2c0._M_elems + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_2c0._M_elems + 0x10))->_M_allocated_capacity = (size_type)&DAT_4014000000000000;
  *(undefined8 *)((long)local_2c0._M_elems + 0x18) = 0;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
   ((long)local_2c0._M_elems + 0x20))->_M_dataplus)._M_p = &DAT_4022000000000000;
  *(size_type *)((long)local_2c0._M_elems + 0x28) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_2c0._M_elems + 0x30))->_M_allocated_capacity = (size_type)&DAT_402a000000000000;
  *(undefined8 *)((long)local_2c0._M_elems + 0x38) = 0;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
   ((long)local_2c0._M_elems + 0x40))->_M_dataplus)._M_p = (pointer)0x4000000000000000;
  *(size_type *)((long)local_2c0._M_elems + 0x48) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_2c0._M_elems + 0x50))->_M_allocated_capacity = (size_type)&DAT_4018000000000000;
  *(undefined8 *)((long)local_2c0._M_elems + 0x58) = 0;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
   ((long)local_2c0._M_elems + 0x60))->_M_dataplus)._M_p = &DAT_4024000000000000;
  *(size_type *)((long)local_2c0._M_elems + 0x68) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_2c0._M_elems + 0x70))->_M_allocated_capacity = (size_type)&DAT_402c000000000000;
  *(undefined8 *)((long)local_2c0._M_elems + 0x78) = 0;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
   ((long)local_2c0._M_elems + 0x80))->_M_dataplus)._M_p = &DAT_4008000000000000;
  *(size_type *)((long)local_2c0._M_elems + 0x88) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_2c0._M_elems + 0x90))->_M_allocated_capacity = (size_type)&DAT_401c000000000000;
  *(undefined8 *)((long)local_2c0._M_elems + 0x98) = 0;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
   ((long)local_2c0._M_elems + 0xa0))->_M_dataplus)._M_p = &DAT_4026000000000000;
  *(size_type *)((long)local_2c0._M_elems + 0xa8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_2c0._M_elems + 0xb0))->_M_allocated_capacity = (size_type)&DAT_402e000000000000;
  *(undefined8 *)((long)local_2c0._M_elems + 0xb8) = 0;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
   ((long)local_2c0._M_elems + 0xc0))->_M_dataplus)._M_p = &DAT_4010000000000000;
  *(size_type *)((long)local_2c0._M_elems + 200) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_2c0._M_elems + 0xd0))->_M_allocated_capacity = (size_type)&DAT_4020000000000000;
  *(undefined8 *)((long)local_2c0._M_elems + 0xd8) = 0;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
   ((long)local_2c0._M_elems + 0xe0))->_M_dataplus)._M_p = &DAT_4028000000000000;
  *(size_type *)((long)local_2c0._M_elems + 0xe8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_2c0._M_elems + 0xf0))->_M_allocated_capacity = (size_type)&DAT_4030000000000000;
  *(undefined8 *)((long)local_2c0._M_elems + 0xf8) = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_2e0,
             (SquareMatrix<std::complex<double>_> *)local_2c8);
  auVar21 = (undefined1  [8])0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_2e0,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_c8,(SquareMatrix<std::complex<double>_> *)local_2c8);
  local_310 = (undefined1  [8])&DAT_00000004;
  local_308._M_head_impl = (complex<double> *)operator_new__(0x100);
  *(undefined8 *)(local_308._M_head_impl)->_M_value = 0x3ff0000000000000;
  *(undefined8 *)((long)(local_308._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[4]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[4]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[5]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[5]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[6]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_308._M_head_impl[6]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[7]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[7]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[8]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[8]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[9]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_308._M_head_impl[9]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[10]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[10]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[0xb]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[0xb]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[0xc]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[0xc]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[0xd]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[0xd]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[0xe]._M_value = 0;
  *(undefined8 *)(local_308._M_head_impl[0xe]._M_value + 8) = 0;
  *(undefined8 *)local_308._M_head_impl[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_308._M_head_impl[0xf]._M_value + 8) = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            (&local_c8,(SquareMatrix<std::complex<double>_> *)local_310);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_268,&local_c8);
  if (local_268 == local_2e0) {
    if (0 < (long)local_268) {
      psVar11 = (size_type *)((long)local_2d8._M_head_impl + 8);
      piVar12 = (pointer)((long)_Stack_260._M_head_impl + 8);
      lVar9 = 0;
      uVar23 = 0;
      do {
        lVar19 = 0;
        auVar21 = local_268;
        do {
          dVar2 = *(double *)((long)piVar12 + lVar19 + -8);
          pdVar1 = (double *)((long)psVar11 + lVar19 + -8);
          uVar24 = uVar23;
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((*(double *)((long)piVar12 + lVar19) != *(double *)((long)psVar11 + lVar19) ||
              (uVar24 = 0,
              NAN(*(double *)((long)piVar12 + lVar19)) || NAN(*(double *)((long)psVar11 + lVar19))))
             )) goto LAB_00347f45;
          lVar19 = lVar19 + 0x10;
          auVar21 = (undefined1  [8])((long)auVar21 + -1);
        } while (auVar21 != (undefined1  [8])0x0);
        lVar9 = lVar9 + 1;
        psVar11 = psVar11 + (long)local_268 * 2;
        piVar12 = piVar12 + (long)local_268 * 4;
      } while ((undefined1  [8])lVar9 != local_268);
    }
    uVar24 = 1;
  }
  else {
    uVar24 = 0;
  }
LAB_00347f45:
  local_2f8[0] = (internal)uVar24;
  local_2f0._M_head_impl = (complex<double> *)0x0;
  if (_Stack_260._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(_Stack_260._M_head_impl);
  }
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_308._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_308._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_c8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_c8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_c8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_2f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2f8,
               (AssertionResult *)"mat2 == mat * swap.matrix()","false","true",(char *)auVar21);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xc4,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_310 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_310 + 8))();
    }
  }
  if (local_2f0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_2e0,
             (SquareMatrix<std::complex<double>_> *)local_2c8);
  auVar21 = (undefined1  [8])0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_2e0,0);
  local_d8.size_ = 4;
  local_d8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )operator_new__(0x100);
  *(undefined8 *)
   ((complex<double> *)
   local_d8.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value = 0x3ff0000000000000
  ;
  *(undefined8 *)
   ((long)((complex<double> *)
          local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x40))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x40))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x50))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x50))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x60))->_M_value =
       0x3ff0000000000000;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x60))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x70))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x70))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x80))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x80))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x90))->_M_value =
       0x3ff0000000000000;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x90))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xa0))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xa0))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xb0))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xb0))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xc0))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xc0))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xd0))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xd0))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xe0))->_M_value = 0;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xe0))->_M_value + 8
   ) = 0;
  *(undefined8 *)
   ((complex<double> *)
   ((long)local_d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xf0))->_M_value =
       0x3ff0000000000000;
  *(undefined8 *)
   (((complex<double> *)
    ((long)local_d8.data_._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xf0))->_M_value + 8
   ) = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            (&local_d8,(SquareMatrix<std::complex<double>_> *)local_2c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_268,&local_d8);
  if (local_268 == local_2e0) {
    if (0 < (long)local_268) {
      psVar11 = (size_type *)((_Alloc_hider *)(local_2d8._M_head_impl)->_M_value + 1);
      piVar12 = (pointer)((long)(_Stack_260._M_head_impl)->_M_value + 8);
      lVar9 = 0;
      uVar23 = 0;
      do {
        lVar19 = 0;
        auVar21 = local_268;
        do {
          dVar2 = *(double *)((long)piVar12 + lVar19 + -8);
          pdVar1 = (double *)((long)psVar11 + lVar19 + -8);
          uVar24 = uVar23;
          if ((((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
              (*(double *)((long)piVar12 + lVar19) != *(double *)((long)psVar11 + lVar19))) ||
             (uVar24 = 0,
             NAN(*(double *)((long)piVar12 + lVar19)) || NAN(*(double *)((long)psVar11 + lVar19))))
          goto LAB_003481d1;
          lVar19 = lVar19 + 0x10;
          auVar21 = (undefined1  [8])((long)auVar21 + -1);
        } while (auVar21 != (undefined1  [8])0x0);
        lVar9 = lVar9 + 1;
        psVar11 = psVar11 + (long)local_268 * 2;
        piVar12 = piVar12 + (long)local_268 * 4;
      } while ((undefined1  [8])lVar9 != local_268);
    }
    uVar24 = 1;
  }
  else {
    uVar24 = 0;
  }
LAB_003481d1:
  local_2f8[0] = (internal)uVar24;
  local_2f0._M_head_impl = (complex<double> *)0x0;
  if (_Stack_260._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(_Stack_260._M_head_impl);
  }
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_d8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_d8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_d8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_2f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2f8,
               (AssertionResult *)"mat2 == swap.matrix() * mat","false","true",(char *)auVar21);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,200,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_310 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_310 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2f0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_2f8,&local_b8);
  _Var22._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_2f8,0);
  local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4;
  local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)operator_new__(0x100);
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish)->_M_value = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)(local_2b0.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[1]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[1]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[2]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[2]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[3]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[3]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[4]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[4]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[5]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[5]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[6]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[6]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[7]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[7]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[8]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[8]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[9]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[9]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[10]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[10]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xb]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xb]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xc]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xc]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xd]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xd]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xe]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xe]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xf]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_268,(SquareMatrix<std::complex<double>_> *)&local_2b0,&local_78);
  if (local_268 == local_2f8) {
    if (0 < (long)local_268) {
      psVar11 = (size_type *)((long)local_2f0._M_head_impl + 8);
      piVar12 = (pointer)((long)(_Stack_260._M_head_impl)->_M_value + 8);
      lVar9 = 0;
      uVar23 = 0;
      do {
        lVar19 = 0;
        _Var22._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
        do {
          dVar2 = *(double *)((long)piVar12 + lVar19 + -8);
          pdVar1 = (double *)((long)psVar11 + lVar19 + -8);
          uVar24 = uVar23;
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((*(double *)((long)piVar12 + lVar19) != *(double *)((long)psVar11 + lVar19) ||
              (uVar24 = 0,
              NAN(*(double *)((long)piVar12 + lVar19)) || NAN(*(double *)((long)psVar11 + lVar19))))
             )) goto LAB_00348447;
          lVar19 = lVar19 + 0x10;
          _Var22._M_head_impl = _Var22._M_head_impl + -1;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var22._M_head_impl !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
        lVar9 = lVar9 + 1;
        psVar11 = psVar11 + (long)local_268 * 2;
        piVar12 = piVar12 + (long)local_268 * 4;
      } while ((undefined1  [8])lVar9 != local_268);
    }
    uVar24 = 1;
  }
  else {
    uVar24 = 0;
  }
LAB_00348447:
  local_310[0] = (allocator_type)uVar24;
  local_308._M_head_impl = (complex<double> *)0x0;
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)_Stack_260._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__(_Stack_260._M_head_impl);
  }
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_2b0.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_310[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_310,
               (AssertionResult *)"mat3 == qclab::dense::kron( swap.matrix() , I1 )","false","true",
               (char *)_Var22._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xcd,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_308._M_head_impl);
  }
  local_328._M_elems[0] = 1;
  local_328._M_elems[1] = 2;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_2f8,&local_b8);
  _Var22._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_2f8,0);
  local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4;
  local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)operator_new__(0x100);
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish)->_M_value = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)(local_2b0.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[1]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[1]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[2]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[2]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[3]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[3]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[4]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[4]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[5]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[5]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[6]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[6]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[7]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[7]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[8]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[8]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[9]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[9]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[10]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[10]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xb]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xb]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xc]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xc]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xd]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xd]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xe]._M_value = 0;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xe]._M_value + 8) = 0;
  *(undefined8 *)
   local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)
   (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish[0xf]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)local_268,&local_78,(SquareMatrix<std::complex<double>_> *)&local_2b0);
  if (local_268 == local_2f8) {
    if (0 < (long)local_268) {
      psVar11 = (size_type *)((_Alloc_hider *)(local_2f0._M_head_impl)->_M_value + 1);
      piVar12 = (pointer)((long)(_Stack_260._M_head_impl)->_M_value + 8);
      _Var18._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      uVar24 = 0;
      do {
        lVar9 = 0;
        _Var22._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
        do {
          dVar2 = *(double *)((long)piVar12 + lVar9 + -8);
          pdVar1 = (double *)((long)psVar11 + lVar9 + -8);
          if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
             ((*(double *)((long)piVar12 + lVar9) != *(double *)((long)psVar11 + lVar9) ||
              (NAN(*(double *)((long)piVar12 + lVar9)) || NAN(*(double *)((long)psVar11 + lVar9)))))
             ) goto LAB_003486bf;
          lVar9 = lVar9 + 0x10;
          _Var22._M_head_impl = _Var22._M_head_impl + -1;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var22._M_head_impl !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0);
        _Var18._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )((long)_Var18._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 1);
        psVar11 = psVar11 + (long)local_268 * 2;
        piVar12 = piVar12 + (long)local_268 * 4;
      } while (_Var18._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl !=
               (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )local_268);
    }
    uVar24 = 1;
  }
  else {
    uVar24 = 0;
  }
LAB_003486bf:
  local_310[0] = (allocator_type)uVar24;
  local_308._M_head_impl = (complex<double> *)0x0;
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)_Stack_260._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__(_Stack_260._M_head_impl);
  }
  _Stack_260._M_head_impl = (complex<double> *)0x0;
  if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != (complex<double> *)0x0) {
    operator_delete__(local_2b0.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_310[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_310,
               (AssertionResult *)"mat3 == qclab::dense::kron( I1 , swap.matrix() )","false","true",
               (char *)_Var22._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xd3,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2b0.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_2b0.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_308._M_head_impl);
  }
  if (local_2f0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_2f0._M_head_impl);
  }
  if (local_2c0._M_elems != (_Type)0x0) {
    operator_delete__((void *)local_2c0._M_elems);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_2d8._M_head_impl);
  }
  local_330 = (undefined1  [8])&PTR_nbQubits_004ee530;
  local_328._M_elems[0] = 0;
  local_328._M_elems[1] = 2;
  puVar7 = (undefined8 *)operator_new__(0x400);
  memset(puVar7 + 2,0,0x3e0);
  *puVar7 = 0x3ff0000000000000;
  puVar7[1] = 0;
  puVar7[0x18] = 0x3ff0000000000000;
  puVar7[0x24] = 0x3ff0000000000000;
  puVar7[0x3c] = 0x3ff0000000000000;
  puVar7[0x42] = 0x3ff0000000000000;
  puVar7[0x5a] = 0x3ff0000000000000;
  puVar7[0x66] = 0x3ff0000000000000;
  puVar7[0x7e] = 0x3ff0000000000000;
  puVar7[0x7f] = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_2e0,&local_b8);
  pcVar20 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<double>_>::apply
            ((SWAP<std::complex<double>_> *)local_330,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_2e0,0);
  if (local_2e0 == (undefined1  [8])&DAT_00000008) {
    psVar11 = (size_type *)((long)local_2d8._M_head_impl + 8);
    puVar8 = puVar7 + 1;
    lVar9 = 0;
    do {
      lVar19 = 0;
      do {
        dVar2 = *(double *)((long)puVar8 + lVar19 + -8);
        pdVar1 = (double *)((long)psVar11 + lVar19 + -8);
        if ((((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
            (*(double *)((long)puVar8 + lVar19) != *(double *)((long)psVar11 + lVar19))) ||
           (NAN(*(double *)((long)puVar8 + lVar19)) || NAN(*(double *)((long)psVar11 + lVar19))))
        goto LAB_003488f2;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x80);
      lVar9 = lVar9 + 1;
      psVar11 = psVar11 + 0x10;
      puVar8 = puVar8 + 0x10;
    } while (lVar9 != 8);
  }
  else {
LAB_003488f2:
    local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffffffffff00);
    local_2c0._M_elems[0] = 0;
    local_2c0._M_elems[1] = 0;
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_2c8,(AssertionResult *)"mat3 == check","false",
               "true",pcVar20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xe6,(char *)local_268);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_2f8 + 8))();
    }
    if (local_2c0._M_elems != (_Type)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2c0._M_elems);
    }
  }
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)local_2d8._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__(local_2d8._M_head_impl);
  }
  operator_delete__(puVar7);
  if (local_a8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_b8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_b8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_50.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_50.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)
      local_78.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_78.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_qgates_SWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::SWAP< T >  swap ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( swap.qubit() , 0 ) ;

    // qubits
    auto qubits = swap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    swap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;

    // matrix
    qclab::dense::SquareMatrix< T >  SWAP_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( swap.matrix() == SWAP_check ) ;

    // print
    swap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( swap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "swap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::SWAP< T >  swap2( 2 , 4 ) ;
    EXPECT_TRUE(  swap == swap2 ) ;
    EXPECT_FALSE( swap != swap2 ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 3 , 5 ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::SWAP< T >  swap( &qubits[0] ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    swap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , 2 , 5 , 7 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { swap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 , 7 , 2 , 8 , 9 , 5 , 6 , 5 , 1};
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , 7 , 2 , 5 , 6 , 4 , 1 , 8 , 3 , 8 , 9 , 5 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 , 7 , 5 , 2 , 6 , 8 , 5 , 9 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 4 , 2 , 8 , 5 , 1 , 7 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == mat * swap.matrix() ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( swap.matrix() , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 , swap.matrix() ) ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = 1 ;
    check(2,2) = 1 ;
    check(6,3) = 1 ;
    check(1,4) = 1 ;
    check(5,5) = 1 ;
    check(3,6) = 1 ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == check ) ;
  }

}